

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Printer
          (Printer *this,ZeroCopyOutputStream *output,char variable_delimiter,
          AnnotationCollector *annotation_collector)

{
  Options options;
  Options local_68;
  AnnotationCollector *local_28;
  AnnotationCollector *annotation_collector_local;
  ZeroCopyOutputStream *pZStack_18;
  char variable_delimiter_local;
  ZeroCopyOutputStream *output_local;
  Printer *this_local;
  
  local_28 = annotation_collector;
  annotation_collector_local._7_1_ = variable_delimiter;
  pZStack_18 = output;
  output_local = (ZeroCopyOutputStream *)this;
  Options::Options(&local_68,variable_delimiter,annotation_collector);
  options.annotation_collector = local_68.annotation_collector;
  options.variable_delimiter = local_68.variable_delimiter;
  options._1_7_ = local_68._1_7_;
  options.comment_start._M_len = local_68.comment_start._M_len;
  options.comment_start._M_str = local_68.comment_start._M_str;
  options.ignored_comment_start._M_len = local_68.ignored_comment_start._M_len;
  options.ignored_comment_start._M_str = local_68.ignored_comment_start._M_str;
  options.spaces_per_indent = local_68.spaces_per_indent;
  options.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       local_68.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  options._58_6_ = local_68._58_6_;
  Printer(this,output,options);
  return;
}

Assistant:

Printer::Printer(ZeroCopyOutputStream* output, char variable_delimiter,
                 AnnotationCollector* annotation_collector)
    : Printer(output, Options{variable_delimiter, annotation_collector}) {}